

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_gate.c
# Opt level: O2

void gate_release(gate *g)

{
  int id;
  skynet_context *ctx;
  messagepool_list *pmVar1;
  messagepool_list *__ptr;
  long lVar2;
  long lVar3;
  
  ctx = g->ctx;
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < g->max_connection; lVar2 = lVar2 + 1) {
    id = *(int *)(g->conn->remote_name + lVar3 + -0xc);
    if (-1 < id) {
      skynet_socket_close(ctx,id);
    }
    lVar3 = lVar3 + 0x50;
  }
  if (-1 < g->listen_id) {
    skynet_socket_close(ctx,g->listen_id);
  }
  __ptr = (g->mp).pool;
  while (__ptr != (messagepool_list *)0x0) {
    pmVar1 = __ptr->next;
    free(__ptr);
    __ptr = pmVar1;
  }
  (g->mp).pool = (messagepool_list *)0x0;
  (g->mp).freelist = (message *)0x0;
  free((g->hash).id);
  free((g->hash).hash);
  (g->hash).id = (hashid_node *)0x0;
  (g->hash).hash = (hashid_node **)0x0;
  (g->hash).hashmod = 1;
  (g->hash).cap = 0;
  (g->hash).count = 0;
  free(g->conn);
  free(g);
  return;
}

Assistant:

void
gate_release(struct gate *g) {
	int i;
	struct skynet_context *ctx = g->ctx;
	for (i=0;i<g->max_connection;i++) {
		struct connection *c = &g->conn[i];
		if (c->id >=0) {
			skynet_socket_close(ctx, c->id);
		}
	}
	if (g->listen_id >= 0) {
		skynet_socket_close(ctx, g->listen_id);
	}
	messagepool_free(&g->mp);
	hashid_clear(&g->hash);
	skynet_free(g->conn);
	skynet_free(g);
}